

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O0

void timer_cb(uv_timer_t *timer)

{
  int iVar1;
  void **ppvVar2;
  uint64_t uVar3;
  poll_ctx *ctx;
  uv_timer_t *timer_local;
  
  ppvVar2 = timer[-1].heap_node + 1;
  if (*ppvVar2 == (void *)0x0) {
    __assert_fail("ctx->parent_handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/fs-poll.c"
                  ,0xb0,"void timer_cb(uv_timer_t *)");
  }
  if ((void **)*(long **)((long)*ppvVar2 + 0x60) == ppvVar2) {
    uVar3 = uv_now((uv_loop_t *)timer[-1].repeat);
    timer[-1].timeout = uVar3;
    iVar1 = uv_fs_stat((uv_loop_t *)timer[-1].repeat,(uv_fs_t *)(timer + 1),(char *)(timer + 5),
                       poll_cb);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/fs-poll.c"
                ,0xb1,"void timer_cb(uv_timer_t *)");
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  uv_buf_t buf = uv_buf_init("PING", 4);
  ASSERT(0 == uv_write(&write_req,
                       (uv_stream_t*) &tcp_handle,
                       &buf,
                       1,
                       write_cb));
  ASSERT(0 == uv_read_stop((uv_stream_t*) &tcp_handle));
}